

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O3

void __thiscall HMatrix::compute_matB_vec(HMatrix *this,double *vec,int *base,HVector *result)

{
  double dVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer piVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  
  HVector::clear(result);
  iVar11 = this->numRow;
  uVar9 = (ulong)iVar11;
  if (0 < (long)uVar9) {
    piVar4 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (result->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = this->numCol;
    piVar6 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = 0;
    do {
      dVar1 = vec[uVar12];
      if (1e-14 < ABS(dVar1)) {
        iVar14 = base[uVar12];
        if (iVar14 < iVar2) {
          iVar3 = piVar6[iVar14];
          lVar13 = (long)iVar3;
          iVar14 = piVar6[(long)iVar14 + 1];
          if (iVar3 < iVar14) {
            do {
              iVar3 = piVar8[lVar13];
              pdVar5[iVar3] = pdVar7[lVar13] * dVar1 + pdVar5[iVar3];
              lVar13 = lVar13 + 1;
            } while (iVar14 != lVar13);
          }
        }
        else {
          iVar14 = iVar14 - iVar2;
          pdVar5[iVar14] = dVar1 + pdVar5[iVar14];
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar9);
    if (0 < iVar11) {
      lVar13 = 0;
      iVar11 = 0;
      do {
        if (ABS(pdVar5[lVar13]) <= 1e-14) {
          pdVar5[lVar13] = 0.0;
        }
        else {
          lVar10 = (long)iVar11;
          iVar11 = iVar11 + 1;
          piVar4[lVar10] = (int)lVar13;
          uVar9 = (ulong)(uint)this->numRow;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < (int)uVar9);
      goto LAB_001275cb;
    }
  }
  iVar11 = 0;
LAB_001275cb:
  result->count = iVar11;
  return;
}

Assistant:

void HMatrix::compute_matB_vec(const double *vec, const int *base,
        HVector *result) {
    result->clear();
    int resultCount = 0;
    int *resultIndex = &result->index[0];
    double *resultArray = &result->array[0];

    for (int i = 0; i < numRow; i++) {
        int iCol = base[i];
        double value = vec[i];
        if (fabs(value) > HSOL_CONST_TINY) {
            if (iCol < numCol) {
                for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++)
                    resultArray[Aindex[k]] += value * Avalue[k];
            } else {
                resultArray[iCol - numCol] += value;
            }
        }
    }

    for (int i = 0; i < numRow; i++) {
        if (fabs(resultArray[i]) > HSOL_CONST_TINY) {
            resultIndex[resultCount++] = i;
        } else {
            resultArray[i] = 0;
        }
    }
    result->count = resultCount;
}